

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O3

ssize_t __thiscall wasm::ModuleReader::read(ModuleReader *this,int __fd,void *__buf,size_t __nbytes)

{
  Module *wasm;
  bool bVar1;
  int iVar2;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t extraout_RAX_02;
  ssize_t sVar3;
  ssize_t extraout_RAX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  string *this_00;
  _Alloc_hider _Var6;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  Module *local_38;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,__fd);
  if ((plVar5[1] == 0) || (iVar2 = std::__cxx11::string::compare((char *)plVar5), iVar2 == 0)) {
    paVar4 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,*(long *)__nbytes,*(long *)(__nbytes + 8) + *(long *)__nbytes);
    readStdin(this,(Module *)__buf,&local_d8);
    sVar3 = extraout_RAX_01;
    _Var6._M_p = local_d8._M_dataplus._M_p;
  }
  else {
    this_00 = &local_98;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_38 = (Module *)__buf;
    std::__cxx11::string::_M_construct<char*>((string *)&local_98,*plVar5,plVar5[1] + *plVar5);
    bVar1 = isBinaryFile((ModuleReader *)this_00,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    wasm = local_38;
    if (bVar1) {
      paVar4 = &local_78.field_2;
      local_78._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>((string *)&local_78,*plVar5,plVar5[1] + *plVar5);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,*(long *)__nbytes,*(long *)(__nbytes + 8) + *(long *)__nbytes);
      readBinary(this,&local_78,local_38,&local_58);
      sVar3 = extraout_RAX;
      _Var6._M_p = local_78._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        sVar3 = extraout_RAX_00;
        _Var6._M_p = local_78._M_dataplus._M_p;
      }
    }
    else {
      if (*(long *)(__nbytes + 8) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Binaryen ModuleReader::read() - source map filename provided, but file appears to not be binary\n"
                   ,0x60);
      }
      paVar4 = &local_b8.field_2;
      local_b8._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,*plVar5,plVar5[1] + *plVar5);
      readText(this,&local_b8,wasm);
      sVar3 = extraout_RAX_02;
      _Var6._M_p = local_b8._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != paVar4) {
    operator_delete(_Var6._M_p,paVar4->_M_allocated_capacity + 1);
    sVar3 = extraout_RAX_03;
  }
  return sVar3;
}

Assistant:

void ModuleReader::read(std::string filename,
                        Module& wasm,
                        std::string sourceMapFilename) {
  // empty filename or "-" means read from stdin
  if (!filename.size() || filename == "-") {
    readStdin(wasm, sourceMapFilename);
    return;
  }
  if (isBinaryFile(filename)) {
    readBinary(filename, wasm, sourceMapFilename);
  } else {
    // default to text
    if (sourceMapFilename.size()) {
      std::cerr << "Binaryen ModuleReader::read() - source map filename "
                   "provided, but file appears to not be binary\n";
    }
    readText(filename, wasm);
  }
}